

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O2

Oop __thiscall
Lodtalk::MethodSemanticAnalysis::visitSequenceNode(MethodSemanticAnalysis *this,SequenceNode *node)

{
  pointer ppLVar1;
  pointer ppNVar2;
  LocalDeclarations *this_00;
  vector<Lodtalk::AST::LocalDeclaration_*,_std::allocator<Lodtalk::AST::LocalDeclaration_*>_>
  *pvVar3;
  Oop localContext;
  vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_> *pvVar4;
  anon_union_8_4_0eb573b0_for_Oop_0 symbol;
  LocalScope *this_01;
  Node **child;
  pointer ppLVar5;
  pointer ppNVar6;
  shared_ptr<Lodtalk::LocalScope> newScope;
  TemporalVariableLookupPtr res;
  anon_union_8_4_0eb573b0_for_Oop_0 local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_70;
  __shared_ptr<Lodtalk::EvaluationScope,_(__gnu_cxx::_Lock_policy)2> *local_68;
  SequenceNode *local_60;
  LocalDeclarations *local_58;
  _func_int **local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_ptr<Lodtalk::EvaluationScope,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  this_00 = AST::SequenceNode::getLocalDeclarations(node);
  if (this_00 != (LocalDeclarations *)0x0) {
    local_68 = &(this->super_ScopedInterpreter).currentScope.
                super___shared_ptr<Lodtalk::EvaluationScope,_(__gnu_cxx::_Lock_policy)2>;
    local_60 = node;
    std::make_shared<Lodtalk::LocalScope,std::shared_ptr<Lodtalk::EvaluationScope>&>
              ((shared_ptr<Lodtalk::EvaluationScope> *)&local_78);
    local_58 = this_00;
    pvVar3 = AST::LocalDeclarations::getLocals(this_00);
    ppLVar1 = (pvVar3->
              super__Vector_base<Lodtalk::AST::LocalDeclaration_*,_std::allocator<Lodtalk::AST::LocalDeclaration_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    for (ppLVar5 = (pvVar3->
                   super__Vector_base<Lodtalk::AST::LocalDeclaration_*,_std::allocator<Lodtalk::AST::LocalDeclaration_*>_>
                   )._M_impl.super__Vector_impl_data._M_start; symbol = local_78, ppLVar5 != ppLVar1
        ; ppLVar5 = ppLVar5 + 1) {
      localContext = AST::LocalDeclaration::getSymbolOop(*ppLVar5);
      this_01 = (LocalScope *)&local_50;
      LocalScope::addArgument((LocalScope *)&local_50,(Oop)symbol,(Node *)localContext.field_0);
      if (local_50 == (_func_int **)0x0) {
        AbstractASTVisitor::error
                  ((AbstractASTVisitor *)this_01,(Node *)symbol.header,
                   "the argument has the same name as another argument.");
      }
      std::
      vector<std::shared_ptr<Lodtalk::TemporalVariableLookup>,_std::allocator<std::shared_ptr<Lodtalk::TemporalVariableLookup>_>_>
      ::push_back(&this->localVariables,(value_type *)&local_50);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48);
    }
    std::__shared_ptr<Lodtalk::EvaluationScope,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<Lodtalk::LocalScope,void>
              ((__shared_ptr<Lodtalk::EvaluationScope,(__gnu_cxx::_Lock_policy)2> *)&local_40,
               (__shared_ptr<Lodtalk::LocalScope,_(__gnu_cxx::_Lock_policy)2> *)&local_78);
    std::__shared_ptr<Lodtalk::EvaluationScope,_(__gnu_cxx::_Lock_policy)2>::operator=
              (local_68,&local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70);
    this_00 = local_58;
    node = local_60;
  }
  pvVar4 = AST::SequenceNode::getChildren(node);
  ppNVar2 = (pvVar4->super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  for (ppNVar6 = (pvVar4->
                 super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>).
                 _M_impl.super__Vector_impl_data._M_start; ppNVar6 != ppNVar2; ppNVar6 = ppNVar6 + 1
      ) {
    (*(*ppNVar6)->_vptr_Node[2])(*ppNVar6,this);
  }
  if (this_00 != (LocalDeclarations *)0x0) {
    ScopedInterpreter::popScope(&this->super_ScopedInterpreter);
  }
  return (Oop)&NilObject;
}

Assistant:

Oop MethodSemanticAnalysis::visitSequenceNode(SequenceNode *node)
{
    auto decls = node->getLocalDeclarations();
    if(decls)
	{
        auto newScope = std::make_shared<LocalScope> (currentScope);
        for(auto &localDecl : decls->getLocals())
        {
            auto res = newScope->addArgument(localDecl->getSymbolOop(), localContext);
			if(!res)
				error(localDecl, "the argument has the same name as another argument.");
            localVariables.push_back(res);
        }

        pushScope(newScope);
	}

	for(auto &child : node->getChildren())
		child->acceptVisitor(this);

    if(decls)
        popScope();

    return Oop();
}